

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_event_visitor.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::visit_null
          (basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *this,
          semantic_tag tag,ser_context *context,error_code *ec)

{
  char cVar1;
  bool bVar2;
  target_t tVar3;
  reference pvVar4;
  size_t sVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_RDI;
  error_code *in_stack_ffffffffffffff28;
  level *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  string_view_type *name;
  semantic_tag tag_00;
  basic_json_visitor<char> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff70;
  const_iterator in_stack_ffffffffffffff78;
  
  tag_00 = (semantic_tag)((ulong)in_stack_ffffffffffffff38 >> 0x38);
  pvVar4 = std::
           vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
           ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                   *)in_stack_ffffffffffffff30);
  bVar2 = level::is_key(pvVar4);
  if (!bVar2) {
    pvVar4 = std::
             vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
             ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                     *)in_stack_ffffffffffffff30);
    tVar3 = level::target(pvVar4);
    if (tVar3 != buffer) goto LAB_001a5bc5;
  }
  std::__cxx11::string::clear();
  std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff30,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff28);
  std::__cxx11::string::begin();
  std::__cxx11::string::end();
  std::__cxx11::string::insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff78,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )in_stack_ffffffffffffff70._M_current,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )in_stack_ffffffffffffff68._M_current);
LAB_001a5bc5:
  pvVar4 = std::
           vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
           ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                   *)in_stack_ffffffffffffff30);
  bVar2 = level::is_key(pvVar4);
  cVar1 = (char)in_RDI;
  if (bVar2) {
    pvVar4 = std::
             vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
             ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                     *)in_stack_ffffffffffffff30);
    tVar3 = level::target(pvVar4);
    if (tVar3 == buffer) {
      pvVar4 = std::
               vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
               ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                       *)in_stack_ffffffffffffff30);
      sVar5 = level::count(pvVar4);
      if (sVar5 != 0) {
        std::__cxx11::string::push_back(cVar1 + '8');
      }
      std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffff30,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffff28);
      std::__cxx11::string::begin();
      std::__cxx11::string::end();
      std::__cxx11::string::insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff68);
      std::__cxx11::string::push_back(cVar1 + '8');
    }
    else {
      name = *(string_view_type **)(in_RDI + 0x10);
      std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 0x18));
      basic_json_visitor<char>::key
                (in_stack_ffffffffffffff40,name,(ser_context *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28);
    }
  }
  else {
    pvVar4 = std::
             vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
             ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                     *)in_stack_ffffffffffffff30);
    tVar3 = level::target(pvVar4);
    if (tVar3 == buffer) {
      pvVar4 = std::
               vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
               ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                       *)in_stack_ffffffffffffff30);
      bVar2 = level::is_object(pvVar4);
      if (!bVar2) {
        pvVar4 = std::
                 vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                 ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                         *)in_stack_ffffffffffffff30);
        sVar5 = level::count(pvVar4);
        if (sVar5 != 0) {
          std::__cxx11::string::push_back(cVar1 + '8');
        }
      }
      in_stack_ffffffffffffff30 = (level *)(in_RDI + 0x38);
      __beg._M_current = (char *)std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffff30,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffff28);
      __end._M_current = (char *)std::__cxx11::string::begin();
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::__cxx11::string::end();
      std::__cxx11::string::insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                (this_00,in_stack_ffffffffffffff78,__beg,__end);
    }
    else {
      basic_json_visitor<char>::null_value
                (in_stack_ffffffffffffff40,tag_00,(ser_context *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28);
    }
  }
  std::
  vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
  ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
          *)in_stack_ffffffffffffff30);
  level::advance(in_stack_ffffffffffffff30);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_null(semantic_tag tag, const ser_context& context, std::error_code& ec) override
        {
            if (level_stack_.back().is_key() || level_stack_.back().target() == target_t::buffer)
            {
                key_.clear(); 
                key_.insert(key_.begin(), null_constant.begin(), null_constant.end());
            }

            if (level_stack_.back().is_key())
            {
                switch (level_stack_.back().target())
                {
                    case target_t::buffer:
                        if (level_stack_.back().count() > 0)
                        {
                            key_buffer_.push_back(',');
                        }
                        key_buffer_.insert(key_buffer_.end(), key_.begin(), key_.end());
                        key_buffer_.push_back(':');
                        break;
                    default:
                        destination_->key(key_, context, ec);
                        break;
                }
            }
            else
            {
                switch (level_stack_.back().target())
                {
                    case target_t::buffer:
                        if (!level_stack_.back().is_object() && level_stack_.back().count() > 0)
                        {
                            key_buffer_.push_back(',');
                        }
                        key_buffer_.insert(key_buffer_.end(), key_.begin(), key_.end());
                        break;
                    default:
                        destination_->null_value(tag, context, ec);
                        break;
                }
            }

            level_stack_.back().advance();
            JSONCONS_VISITOR_RETURN;
        }